

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS ref_gather_tec_movie_frame(REF_GRID ref_grid,char *zone_title)

{
  int iVar1;
  REF_GATHER pRVar2;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_GEOM pRVar3;
  double dVar4;
  uint uVar5;
  REF_STATUS RVar6;
  FILE *pFVar7;
  REF_GLOB *pRVar8;
  undefined8 uVar9;
  REF_GLOB *pRVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  REF_GATHER ref_gather;
  REF_INT RVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  REF_GLOB *l2c;
  REF_LONG ncell;
  REF_GLOB nnode;
  REF_EDGE ref_edge;
  REF_DBL edge_ratio;
  REF_DBL quality;
  REF_DBL dot;
  REF_INT nodes [27];
  REF_GLOB *local_100;
  REF_DBL *local_f8;
  REF_GLOB *local_f0;
  REF_GLOB *local_e8;
  int local_dc;
  REF_EDGE local_d8;
  ulong local_d0;
  long local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  REF_HISTOGRAM local_a8 [15];
  
  pRVar2 = ref_grid->gather;
  if (pRVar2->recording == 0) {
    return 0;
  }
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  pRVar3 = ref_grid->geom;
  if ((ref_grid->mpi->id == 0) && (pRVar2->hist_file == (FILE *)0x0)) {
    pFVar7 = fopen("ref_gather_histo.tec","w");
    pRVar2->hist_file = (FILE *)pFVar7;
    if (pFVar7 != (FILE *)0x0) {
LAB_0013139e:
      fwrite("title=\"tecplot refine histogram\"\n",0x21,1,pFVar7);
      fwrite("variables = \"Edge Length\" \"Normalized Count\"\n",0x2d,1,(FILE *)pRVar2->hist_file);
      goto LAB_001313d1;
    }
    puts("unable to open ref_gather_histo.tec");
    pFVar7 = (FILE *)pRVar2->hist_file;
    if (pFVar7 != (FILE *)0x0) goto LAB_0013139e;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x348,
           "ref_gather_tec_histogram_frame","unable to open file");
    uVar18 = 2;
  }
  else {
LAB_001313d1:
    uVar5 = ref_histogram_create(local_a8);
    if (uVar5 == 0) {
      uVar5 = ref_histogram_resolution(local_a8[0],0x120,12.0);
      if (uVar5 == 0) {
        uVar5 = ref_histogram_add_ratio(local_a8[0],ref_grid);
        if (uVar5 == 0) {
          if ((ref_grid->mpi->id == 0) &&
             (uVar5 = ref_histogram_zone(local_a8[0],pRVar2->hist_file,zone_title,pRVar2->time),
             uVar5 != 0)) {
            uVar18 = (ulong)uVar5;
            pcVar14 = "tec zone";
            uVar9 = 0x358;
          }
          else {
            uVar5 = ref_histogram_free(local_a8[0]);
            if (uVar5 == 0) {
              uVar5 = ref_node_synchronize_globals(ref_node);
              if (uVar5 != 0) {
                uVar18 = (ulong)uVar5;
                pcVar14 = "sync";
                uVar9 = 0x375;
                goto LAB_00131564;
              }
              uVar5 = ref_grid_compact_cell_nodes
                                (ref_grid,ref_cell,(REF_GLOB *)&local_e8,(REF_LONG *)&local_f0,
                                 &local_100);
              if (uVar5 != 0) {
                uVar18 = (ulong)uVar5;
                pcVar14 = "l2c";
                uVar9 = 0x378;
                goto LAB_00131564;
              }
              if (ref_grid->mpi->id == 0) {
                if (pRVar2->grid_file == (FILE *)0x0) {
                  pFVar7 = fopen("ref_gather_movie.tec","w");
                  pRVar2->grid_file = (FILE *)pFVar7;
                  if (pFVar7 == (FILE *)0x0) {
                    puts("unable to open ref_gather_movie.tec");
                    pFVar7 = (FILE *)pRVar2->grid_file;
                    if (pFVar7 == (FILE *)0x0) {
                      pcVar14 = "unable to open file";
                      uVar9 = 0x37f;
                      goto LAB_0013183b;
                    }
                  }
                  fwrite("title=\"tecplot refine partition file\"\n",0x26,1,pFVar7);
                  fwrite("variables = \"x\" \"y\" \"z\" \"n\" \"s\" \"l\" \"p\"\n",0x28,1,
                         (FILE *)pRVar2->grid_file);
                }
                if (zone_title == (char *)0x0) {
                  pcVar13 = 
                  "zone t=\"surf\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s, solutiontime=%f\n"
                  ;
                  pcVar15 = "fetriangle";
                  pcVar14 = "point";
                  pRVar8 = local_f0;
                  pRVar10 = local_e8;
                }
                else {
                  pcVar13 = 
                  "zone t=\"%s\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s, solutiontime=%f\n"
                  ;
                  pcVar15 = "point";
                  pRVar8 = local_e8;
                  pRVar10 = (REF_GLOB *)zone_title;
                  pcVar14 = (char *)local_f0;
                }
                fprintf((FILE *)pRVar2->grid_file,pcVar13,pRVar2->time,pRVar10,pRVar8,pcVar14,
                        pcVar15);
              }
              uVar5 = ref_node->max;
              uVar18 = (ulong)uVar5;
              if ((int)uVar5 < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x396,"ref_gather_tec_movie_frame","malloc scalar of REF_DBL negative");
                return 1;
              }
              local_f8 = (REF_DBL *)malloc((ulong)(uVar5 * 4) << 3);
              if (local_f8 == (REF_DBL *)0x0) {
                pcVar14 = "malloc scalar of REF_DBL NULL";
                uVar9 = 0x396;
LAB_0013183b:
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,uVar9,"ref_gather_tec_movie_frame",pcVar14);
                return 2;
              }
              if (uVar18 != 0) {
                pRVar8 = ref_node->global;
                lVar11 = 0;
                do {
                  if (-1 < *(long *)((long)pRVar8 + lVar11 * 2)) {
                    local_f8[lVar11] = 2.0;
                    (local_f8 + lVar11)[1] = 1.0;
                    local_f8[lVar11 + 2] = 1.0;
                    local_f8[lVar11 + 3] = (double)*(int *)((long)ref_node->part + lVar11);
                  }
                  lVar11 = lVar11 + 4;
                } while (uVar18 * 4 - lVar11 != 0);
              }
              local_d0 = uVar18;
              if (pRVar3->model == (void *)0x0) {
                if (ref_grid->twod != 0) {
                  if (pRVar3->meshlink != (void *)0x0) goto LAB_00131761;
                  goto LAB_0013186c;
                }
              }
              else {
LAB_00131761:
                if (0 < ref_cell->max) {
                  RVar16 = 0;
                  do {
                    RVar6 = ref_cell_nodes(ref_cell,RVar16,(REF_INT *)local_a8);
                    if (RVar6 == 0) {
                      uVar5 = ref_geom_tri_norm_deviation(ref_grid,(REF_INT *)local_a8,&local_b0);
                      if (uVar5 != 0) {
                        uVar18 = (ulong)uVar5;
                        pcVar14 = "norm dev";
                        uVar9 = 0x3a0;
                        goto LAB_00131564;
                      }
                      iVar17 = ref_cell->node_per;
                      if (0 < (long)iVar17) {
                        lVar11 = 0;
                        do {
                          lVar12 = (long)*(int *)((long)local_a8 + lVar11 * 4);
                          dVar20 = local_f8[lVar12 * 4];
                          if (local_b0 <= local_f8[lVar12 * 4]) {
                            dVar20 = local_b0;
                          }
                          local_f8[lVar12 * 4] = dVar20;
                          lVar11 = lVar11 + 1;
                        } while (iVar17 != lVar11);
                      }
                    }
                    RVar16 = RVar16 + 1;
                  } while (RVar16 < ref_cell->max);
                }
LAB_0013186c:
                if ((ref_grid->twod != 0) && (0 < ref_cell->max)) {
                  iVar17 = 0;
                  do {
                    RVar6 = ref_cell_nodes(ref_cell,iVar17,(REF_INT *)local_a8);
                    if (RVar6 == 0) {
                      uVar5 = ref_node_tri_quality(ref_node,(REF_INT *)local_a8,&local_b8);
                      if (uVar5 != 0) {
                        uVar18 = (ulong)uVar5;
                        pcVar14 = "tri qual";
                        uVar9 = 0x3a9;
                        goto LAB_00131564;
                      }
                      iVar1 = ref_cell->node_per;
                      if (0 < (long)iVar1) {
                        lVar11 = 0;
                        do {
                          lVar12 = (long)*(int *)((long)local_a8 + lVar11 * 4);
                          dVar20 = local_f8[lVar12 * 4];
                          if (local_b8 <= local_f8[lVar12 * 4]) {
                            dVar20 = local_b8;
                          }
                          local_f8[lVar12 * 4] = dVar20;
                          lVar11 = lVar11 + 1;
                        } while (iVar1 != lVar11);
                      }
                    }
                    iVar17 = iVar17 + 1;
                  } while (iVar17 < ref_cell->max);
                }
                uVar5 = ref_edge_create(&local_d8,ref_grid);
                if (uVar5 != 0) {
                  uVar18 = (ulong)uVar5;
                  pcVar14 = "create edges";
                  uVar9 = 0x3b0;
                  goto LAB_00131564;
                }
                if (0 < local_d8->n) {
                  lVar11 = 0;
                  do {
                    RVar16 = local_d8->e2n[lVar11 * 2];
                    local_dc = local_d8->e2n[lVar11 * 2 + 1];
                    local_c8 = lVar11;
                    uVar5 = ref_node_ratio(ref_node,RVar16,local_dc,&local_c0);
                    if (uVar5 != 0) {
                      uVar18 = (ulong)uVar5;
                      pcVar14 = "ratio";
                      uVar9 = 0x3b4;
                      goto LAB_00131564;
                    }
                    dVar20 = local_f8[(long)RVar16 * 4 + 1];
                    dVar4 = (local_f8 + (long)RVar16 * 4 + 1)[1];
                    uVar18 = -(ulong)(dVar20 < local_c0);
                    uVar19 = -(ulong)(local_c0 < dVar4);
                    local_f8[(long)RVar16 * 4 + 1] =
                         (REF_DBL)(~uVar18 & (ulong)local_c0 | (ulong)dVar20 & uVar18);
                    (local_f8 + (long)RVar16 * 4 + 1)[1] =
                         (REF_DBL)(~uVar19 & (ulong)local_c0 | (ulong)dVar4 & uVar19);
                    dVar20 = local_f8[(long)local_dc * 4 + 1];
                    dVar4 = (local_f8 + (long)local_dc * 4 + 1)[1];
                    uVar18 = -(ulong)(dVar20 < local_c0);
                    uVar19 = -(ulong)(local_c0 < dVar4);
                    local_f8[(long)local_dc * 4 + 1] =
                         (REF_DBL)(~uVar18 & (ulong)local_c0 | (ulong)dVar20 & uVar18);
                    (local_f8 + (long)local_dc * 4 + 1)[1] =
                         (REF_DBL)(~uVar19 & (ulong)local_c0 | (ulong)dVar4 & uVar19);
                    lVar11 = local_c8 + 1;
                  } while (lVar11 < local_d8->n);
                }
                uVar5 = ref_edge_free(local_d8);
                uVar18 = (ulong)uVar5;
                if (uVar5 != 0) {
                  pcVar14 = "free edges";
                  uVar9 = 0x3ba;
                  goto LAB_00131564;
                }
              }
              uVar5 = ref_gather_node_tec_part
                                (ref_node,(REF_GLOB)local_e8,local_100,4,local_f8,pRVar2->grid_file)
              ;
              if (uVar5 == 0) {
                uVar5 = ref_gather_cell_tec(ref_node,ref_cell,(REF_LONG)local_f0,local_100,0,
                                            pRVar2->grid_file);
                if (uVar5 == 0) {
                  if (local_100 != (REF_GLOB *)0x0) {
                    free(local_100);
                  }
                  if (pRVar2->low_quality_zone != 0) {
                    uVar5 = ref_gather_cell_below_quality
                                      ((REF_GRID)ref_grid->mpi,(REF_CELL)ref_grid->node,
                                       pRVar2->min_quality,(REF_GLOB *)ref_grid->cell[8],
                                       (REF_LONG *)&local_e8,&local_f0);
                    if (uVar5 != 0) {
                      uVar18 = (ulong)uVar5;
                      pcVar14 = "cell below";
                      uVar9 = 0x3dd;
                      goto LAB_00131564;
                    }
                    if (0 < (long)local_f0 && local_d0 != 0) {
                      if (ref_grid->mpi->id == 0) {
                        if (zone_title == (char *)0x0) {
                          pcVar13 = 
                          "zone t=\"qtet\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s, solutiontime=%f\n"
                          ;
                          pcVar15 = "fetetrahedron";
                          pcVar14 = "point";
                          pRVar8 = local_f0;
                          zone_title = (char *)local_e8;
                        }
                        else {
                          pcVar13 = 
                          "zone t=\"q%s\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s, solutiontime=%f\n"
                          ;
                          pcVar15 = "point";
                          pRVar8 = local_e8;
                          pcVar14 = (char *)local_f0;
                        }
                        fprintf((FILE *)pRVar2->grid_file,pcVar13,pRVar2->time,zone_title,pRVar8,
                                pcVar14,pcVar15);
                      }
                      uVar5 = ref_gather_node_tec_part
                                        (ref_node,(REF_GLOB)local_e8,local_100,4,local_f8,
                                         pRVar2->grid_file);
                      if (uVar5 != 0) {
                        uVar18 = (ulong)uVar5;
                        pcVar14 = "nodes";
                        uVar9 = 0x3f2;
                        goto LAB_00131564;
                      }
                      uVar5 = ref_gather_cell_quality_tec
                                        (ref_node,ref_grid->cell[8],(REF_LONG)local_f0,local_100,
                                         pRVar2->min_quality,pRVar2->grid_file);
                      if (uVar5 != 0) {
                        uVar18 = (ulong)uVar5;
                        pcVar14 = "qtet";
                        uVar9 = 0x3f6;
                        goto LAB_00131564;
                      }
                    }
                    if (local_100 != (REF_GLOB *)0x0) {
                      free(local_100);
                    }
                  }
                  if (ref_grid->mpi->id == 0) {
                    iVar17 = fflush((FILE *)pRVar2->grid_file);
                    if (iVar17 != 0) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x3fc,"ref_gather_tec_movie_frame","gather movie fflush",0,
                             (long)iVar17);
                      return 1;
                    }
                    pRVar2->time = pRVar2->time + 1.0;
                  }
                  free(local_f8);
                  return 0;
                }
                uVar18 = (ulong)uVar5;
                pcVar14 = "t";
                uVar9 = 0x3d6;
              }
              else {
                uVar18 = (ulong)uVar5;
                pcVar14 = "nodes";
                uVar9 = 0x3d3;
              }
              goto LAB_00131564;
            }
            uVar18 = (ulong)uVar5;
            pcVar14 = "free gram";
            uVar9 = 0x35b;
          }
        }
        else {
          uVar18 = (ulong)uVar5;
          pcVar14 = "add ratio";
          uVar9 = 0x353;
        }
      }
      else {
        uVar18 = (ulong)uVar5;
        pcVar14 = "res";
        uVar9 = 0x351;
      }
    }
    else {
      uVar18 = (ulong)uVar5;
      pcVar14 = "create";
      uVar9 = 0x350;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar9,
           "ref_gather_tec_histogram_frame",uVar18,pcVar14);
  }
  pcVar14 = "hist frame";
  uVar9 = 0x373;
LAB_00131564:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar9,
         "ref_gather_tec_movie_frame",uVar18,pcVar14);
  return (REF_STATUS)uVar18;
}

Assistant:

REF_FCN REF_STATUS ref_gather_tec_movie_frame(REF_GRID ref_grid,
                                              const char *zone_title) {
  REF_GATHER ref_gather = ref_grid_gather(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_GLOB nnode, *l2c;
  REF_LONG ncell;
  REF_DBL *scalar, dot, quality;
  REF_INT edge, node0, node1;
  REF_EDGE ref_edge;
  REF_DBL edge_ratio;
  REF_INT ldim = 4;
  REF_BOOL metric_area = REF_FALSE;

  if (!(ref_gather->recording)) return REF_SUCCESS;

  RSS(ref_gather_tec_histogram_frame(ref_grid, zone_title), "hist frame");

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  RSS(ref_grid_compact_cell_nodes(ref_grid, ref_cell, &nnode, &ncell, &l2c),
      "l2c");

  if (ref_grid_once(ref_grid)) {
    if (NULL == (void *)(ref_gather->grid_file)) {
      ref_gather->grid_file = fopen("ref_gather_movie.tec", "w");
      if (NULL == (void *)(ref_gather->grid_file))
        printf("unable to open ref_gather_movie.tec\n");
      RNS(ref_gather->grid_file, "unable to open file");

      fprintf(ref_gather->grid_file,
              "title=\"tecplot refine partition file\"\n");
      fprintf(ref_gather->grid_file,
              "variables = \"x\" \"y\" \"z\" \"n\" \"s\" \"l\" \"p\"\n");
    }
    if (NULL == zone_title) {
      fprintf(ref_gather->grid_file,
              "zone t=\"surf\", nodes=" REF_GLOB_FMT
              ", elements=%ld, datapacking=%s, "
              "zonetype=%s, solutiontime=%f\n",
              nnode, ncell, "point", "fetriangle", ref_gather->time);
    } else {
      fprintf(ref_gather->grid_file,
              "zone t=\"%s\", nodes=" REF_GLOB_FMT
              ", elements=%ld, datapacking=%s, "
              "zonetype=%s, solutiontime=%f\n",
              zone_title, nnode, ncell, "point", "fetriangle",
              ref_gather->time);
    }
  }

  ref_malloc(scalar, ldim * ref_node_max(ref_node), REF_DBL);
  each_ref_node_valid_node(ref_node, node) {
    scalar[0 + ldim * node] = 2.0;
    scalar[1 + ldim * node] = 1.0;
    scalar[2 + ldim * node] = 1.0;
    scalar[3 + ldim * node] = (REF_DBL)ref_node_part(ref_node, node);
  }
  if (ref_geom_model_loaded(ref_geom) || ref_grid_twod(ref_grid)) {
    if (ref_geom_model_loaded(ref_geom) || ref_geom_meshlinked(ref_geom)) {
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &dot), "norm dev");
        each_ref_cell_cell_node(ref_cell, cell_node) {
          scalar[0 + ldim * nodes[cell_node]] =
              MIN(scalar[0 + ldim * nodes[cell_node]], dot);
        }
      }
    }
    if (ref_grid_twod(ref_grid)) {
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        RSS(ref_node_tri_quality(ref_node, nodes, &quality), "tri qual");
        each_ref_cell_cell_node(ref_cell, cell_node) {
          scalar[0 + ldim * nodes[cell_node]] =
              MIN(scalar[0 + ldim * nodes[cell_node]], quality);
        }
      }
    }
    RSS(ref_edge_create(&ref_edge, ref_grid), "create edges");
    for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
      node0 = ref_edge_e2n(ref_edge, 0, edge);
      node1 = ref_edge_e2n(ref_edge, 1, edge);
      RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
      scalar[1 + ldim * node0] = MIN(scalar[1 + ldim * node0], edge_ratio);
      scalar[1 + ldim * node1] = MIN(scalar[1 + ldim * node1], edge_ratio);
      scalar[2 + ldim * node0] = MAX(scalar[2 + ldim * node0], edge_ratio);
      scalar[2 + ldim * node1] = MAX(scalar[2 + ldim * node1], edge_ratio);
    }
    RSS(ref_edge_free(ref_edge), "free edges");
  }

  if (metric_area && ref_grid_twod(ref_grid)) {
    REF_DBL area;
    REF_INT i, *hits;
    ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
    each_ref_node_valid_node(ref_node, node) { scalar[3 + ldim * node] = 0.0; }
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_node_tri_metric_area(ref_node, nodes, &area), "tri area");
      for (i = 0; i < 3; i++) {
        scalar[3 + ldim * nodes[i]] += area;
        (hits[nodes[i]])++;
      }
    }
    each_ref_node_valid_node(ref_node, node) {
      if (hits[node] > 0) {
        scalar[3 + ldim * node] /= ((REF_DBL)hits[node]);
      }
    }
    ref_free(hits);
  }

  RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, ldim, scalar,
                               ref_gather->grid_file),
      "nodes");
  RSS(ref_gather_cell_tec(ref_node, ref_cell, ncell, l2c, REF_FALSE,
                          ref_gather->grid_file),
      "t");
  ref_free(l2c);

  if (ref_gather_low_quality_zone(ref_gather)) {
    RSS(ref_gather_cell_below_quality(ref_grid, ref_grid_tet(ref_grid),
                                      ref_gather->min_quality, &nnode, &ncell,
                                      &l2c),
        "cell below");

    if (node > 0 && ncell > 0) {
      if (ref_grid_once(ref_grid)) {
        if (NULL == zone_title) {
          fprintf(ref_gather->grid_file,
                  "zone t=\"qtet\", nodes=" REF_GLOB_FMT
                  ", elements=%ld, datapacking=%s, "
                  "zonetype=%s, solutiontime=%f\n",
                  nnode, ncell, "point", "fetetrahedron", ref_gather->time);
        } else {
          fprintf(ref_gather->grid_file,
                  "zone t=\"q%s\", nodes=" REF_GLOB_FMT
                  ", elements=%ld, datapacking=%s, "
                  "zonetype=%s, solutiontime=%f\n",
                  zone_title, nnode, ncell, "point", "fetetrahedron",
                  ref_gather->time);
        }
      }
      RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, ldim, scalar,
                                   ref_gather->grid_file),
          "nodes");
      RSS(ref_gather_cell_quality_tec(ref_node, ref_grid_tet(ref_grid), ncell,
                                      l2c, ref_gather->min_quality,
                                      ref_gather->grid_file),
          "qtet");
    }
    ref_free(l2c);
  }

  if (ref_grid_once(ref_grid)) {
    REIS(0, fflush(ref_gather->grid_file), "gather movie fflush");
    (ref_gather->time) += 1.0;
  }

  ref_free(scalar);

  return REF_SUCCESS;
}